

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void AddNewRoom(void)

{
  long lVar1;
  Admin *this;
  undefined8 in_RAX;
  char *pcVar2;
  Room *room;
  uint *puVar3;
  int access;
  int id;
  undefined8 local_38;
  
  local_38 = in_RAX;
  pcVar2 = (char *)operator_new__(100);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Room Name : \n",0xd);
  lVar1 = *(long *)(_ITM_registerTMCloneTable + *(long *)(std::cin + -0x18));
  std::__istream_extract((istream *)&std::cin,pcVar2,100);
  if (((*(int *)(std::ios_base::Init::~Init + *(long *)(std::cin + -0x18)) == 0) &&
      (lVar1 - 0x65U < 0xffffffffffffff9c)) &&
     (lVar1 = *(long *)(*(long *)(std::cin + -0x18) + 0x10a1d8),
     *(ulong *)(lVar1 + 0x18) <= *(ulong *)(lVar1 + 0x10))) {
    AddNewRoom();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Room number : \n",0xf);
  std::istream::operator>>((istream *)&std::cin,(int *)((long)&local_38 + 4));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Standard Access level for Room : \n",0x22);
  std::istream::operator>>((istream *)&std::cin,(int *)&local_38);
  this = root;
  room = (Room *)operator_new(0x28);
  room->standardAccess = 1;
  room->specialAccessedUsers_len = 0;
  room->specialAccessedUsers_count = 1;
  puVar3 = (uint *)operator_new__(4);
  room->specialAccessedUsers = puVar3;
  room->name = pcVar2;
  room->standardAccess = (uint)local_38;
  room->room_id = local_38._4_4_;
  Admin::addNewRoom(this,room);
  return;
}

Assistant:

void AddNewRoom(){
    char* name = new char[100];
    cout<<"Room Name : \n";
    cin>>name;
    int id;
    cout<<"Room number : \n";
    cin>>id;
    int access;
    cout<<"Standard Access level for Room : \n";
    cin>>access;
    root->addNewRoom(new Room(name,id,access));
}